

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Maybe<kj::Own<kj::_::Event>_> __thiscall
kj::_::EagerPromiseNodeBase::fire(EagerPromiseNodeBase *this)

{
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event>_> MVar1;
  NullableValue<kj::Exception> exception;
  Runnable local_2f0 [2];
  NullableValue<kj::Exception> local_2e0;
  NullableValue<kj::Exception> local_180;
  
  (**(code **)(**(long **)(in_RSI + 0x38) + 0x10))
            (*(long **)(in_RSI + 0x38),*(undefined8 *)(in_RSI + 0x48));
  local_2f0[0]._vptr_Runnable = (_func_int **)&PTR_run_00678088;
  runCatchingExceptions((Maybe<kj::Exception> *)&local_180,local_2f0);
  NullableValue<kj::Exception>::NullableValue(&local_2e0,&local_180);
  NullableValue<kj::Exception>::~NullableValue(&local_180);
  if (local_2e0.isSet == true) {
    ExceptionOrValue::addException(*(ExceptionOrValue **)(in_RSI + 0x48),&local_2e0.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_2e0);
  PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(in_RSI + 0x40));
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)0x0;
  (this->super_Event)._vptr_Event = (_func_int **)0x0;
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<Event>> EagerPromiseNodeBase::fire() {
  dependency->get(resultRef);
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([this]() {
    dependency = nullptr;
  })) {
    resultRef.addException(kj::mv(*exception));
  }

  onReadyEvent.arm();
  return nullptr;
}